

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_buffer.cc
# Opt level: O2

Slice * __thiscall raptor::SliceBuffer::Merge(Slice *__return_storage_ptr__,SliceBuffer *this)

{
  Slice *oth;
  long lVar1;
  uint8_t *__dest;
  size_t __n;
  uint8_t *__src;
  pointer this_00;
  
  oth = (this->_vs).super__Vector_base<raptor::Slice,_std::allocator<raptor::Slice>_>._M_impl.
        super__Vector_impl_data._M_start;
  lVar1 = (long)(this->_vs).super__Vector_base<raptor::Slice,_std::allocator<raptor::Slice>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)oth >> 5;
  if (lVar1 == 1) {
    Slice::Slice(__return_storage_ptr__,oth);
  }
  else if (lVar1 == 0) {
    Slice::Slice(__return_storage_ptr__);
  }
  else {
    MakeSliceByLength(__return_storage_ptr__,this->_length);
    __dest = Slice::begin(__return_storage_ptr__);
    for (this_00 = (this->_vs).super__Vector_base<raptor::Slice,_std::allocator<raptor::Slice>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        this_00 !=
        (this->_vs).super__Vector_base<raptor::Slice,_std::allocator<raptor::Slice>_>._M_impl.
        super__Vector_impl_data._M_finish; this_00 = this_00 + 1) {
      __n = Slice::size(this_00);
      if (__n != 0) {
        __src = Slice::begin(this_00);
        memcpy(__dest,__src,__n);
        __dest = __dest + __n;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Slice SliceBuffer::Merge() const {

    if (Count() == 0) {
        return Slice();
    }

    if (Count() == 1) {
        return _vs[0];
    }

    size_t len = GetBufferLength();
    Slice ret = MakeSliceByLength(len);
    uint8_t* buf = ret.Buffer();
    for (auto it = _vs.begin(); it != _vs.end(); ++it) {
        size_t blk_size = it->size();
        if (blk_size > 0) {
            memcpy(buf, it->begin(), blk_size);
            buf += blk_size;
        }
    }
    return ret;
}